

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O3

void __thiscall brynet::net::DataSocket::canSend(DataSocket *this)

{
  removeCheckWrite(this);
  this->mCanWrite = true;
  runAfterFlush(this);
  return;
}

Assistant:

void DataSocket::canSend()
{
#ifdef PLATFORM_WINDOWS
    mPostWriteCheck = false;
    if (mSocket == nullptr && !mPostRecvCheck)
    {
        onClose();
        return;
    }
#else
    removeCheckWrite();
#endif
    mCanWrite = true;

#ifdef USE_OPENSSL
    if (!mIsHandsharked && mSSL != nullptr)
    {
        processSSLHandshake();
        return;
    }
#endif

    runAfterFlush();
}